

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall caffe::LayerParameter::Clear(LayerParameter *this)

{
  bool bVar1;
  string *psVar2;
  LogMessage *pLVar3;
  LogFinisher local_cda;
  byte local_cd9;
  LogMessage local_cd8;
  LogFinisher local_c9a;
  byte local_c99;
  LogMessage local_c98;
  LogFinisher local_c5a;
  byte local_c59;
  LogMessage local_c58;
  LogFinisher local_c1a;
  byte local_c19;
  LogMessage local_c18;
  LogFinisher local_bda;
  byte local_bd9;
  LogMessage local_bd8;
  LogFinisher local_b9a;
  byte local_b99;
  LogMessage local_b98;
  LogFinisher local_b5a;
  byte local_b59;
  LogMessage local_b58;
  LogFinisher local_b1a;
  byte local_b19;
  LogMessage local_b18;
  LogFinisher local_ada;
  byte local_ad9;
  LogMessage local_ad8;
  LogFinisher local_a9a;
  byte local_a99;
  LogMessage local_a98;
  LogFinisher local_a5a;
  byte local_a59;
  LogMessage local_a58;
  LogFinisher local_a1a;
  byte local_a19;
  LogMessage local_a18;
  LogFinisher local_9da;
  byte local_9d9;
  LogMessage local_9d8;
  LogFinisher local_99a;
  byte local_999;
  LogMessage local_998;
  LogFinisher local_95a;
  byte local_959;
  LogMessage local_958;
  LogFinisher local_91a;
  byte local_919;
  LogMessage local_918;
  LogFinisher local_8da;
  byte local_8d9;
  LogMessage local_8d8;
  LogFinisher local_89a;
  byte local_899;
  LogMessage local_898;
  LogFinisher local_85a;
  byte local_859;
  LogMessage local_858;
  LogFinisher local_81a;
  byte local_819;
  LogMessage local_818;
  LogFinisher local_7da;
  byte local_7d9;
  LogMessage local_7d8;
  LogFinisher local_79a;
  byte local_799;
  LogMessage local_798;
  LogFinisher local_75a;
  byte local_759;
  LogMessage local_758;
  LogFinisher local_71a;
  byte local_719;
  LogMessage local_718;
  LogFinisher local_6da;
  byte local_6d9;
  LogMessage local_6d8;
  LogFinisher local_69a;
  byte local_699;
  LogMessage local_698;
  LogFinisher local_65a;
  byte local_659;
  LogMessage local_658;
  LogFinisher local_61a;
  byte local_619;
  LogMessage local_618;
  LogFinisher local_5da;
  byte local_5d9;
  LogMessage local_5d8;
  LogFinisher local_59a;
  byte local_599;
  LogMessage local_598;
  LogFinisher local_55a;
  byte local_559;
  LogMessage local_558;
  LogFinisher local_51a;
  byte local_519;
  LogMessage local_518;
  LogFinisher local_4da;
  byte local_4d9;
  LogMessage local_4d8;
  LogFinisher local_49a;
  byte local_499;
  LogMessage local_498;
  LogFinisher local_45a;
  byte local_459;
  LogMessage local_458;
  LogFinisher local_41a;
  byte local_419;
  LogMessage local_418;
  LogFinisher local_3da;
  byte local_3d9;
  LogMessage local_3d8;
  LogFinisher local_39a;
  byte local_399;
  LogMessage local_398;
  LogFinisher local_35a;
  byte local_359;
  LogMessage local_358;
  LogFinisher local_31a;
  byte local_319;
  LogMessage local_318;
  LogFinisher local_2da;
  byte local_2d9;
  LogMessage local_2d8;
  LogFinisher local_29a;
  byte local_299;
  LogMessage local_298;
  LogFinisher local_25a;
  byte local_259;
  LogMessage local_258;
  LogFinisher local_21a;
  byte local_219;
  LogMessage local_218;
  LogFinisher local_1da;
  byte local_1d9;
  LogMessage local_1d8;
  LogFinisher local_19a;
  byte local_199;
  LogMessage local_198;
  LogFinisher local_15a;
  byte local_159;
  LogMessage local_158;
  LogFinisher local_11a;
  byte local_119;
  LogMessage local_118;
  LogFinisher local_dd [20];
  byte local_c9;
  LogMessage local_c8;
  LayerParameter *local_90;
  LayerParameter *this_local;
  InternalMetadataWithArena *local_80;
  undefined4 local_74;
  HasBits<2UL> *local_70;
  undefined4 local_64;
  HasBits<2UL> *local_60;
  undefined4 local_54;
  HasBits<2UL> *local_50;
  undefined4 local_44;
  HasBits<2UL> *local_40;
  undefined4 local_34;
  HasBits<2UL> *local_30;
  undefined4 local_24;
  HasBits<2UL> *local_20;
  HasBits<2UL> *local_18;
  InternalMetadataWithArena *local_10;
  
  local_90 = this;
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Clear(&this->bottom_);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Clear(&this->top_);
  google::protobuf::RepeatedField<float>::Clear(&this->loss_weight_);
  google::protobuf::RepeatedPtrField<caffe::ParamSpec>::Clear(&this->param_);
  google::protobuf::RepeatedPtrField<caffe::BlobProto>::Clear(&this->blobs_);
  google::protobuf::RepeatedPtrField<caffe::NetStateRule>::Clear(&this->include_);
  google::protobuf::RepeatedPtrField<caffe::NetStateRule>::Clear(&this->exclude_);
  google::protobuf::RepeatedField<bool>::Clear(&this->propagate_down_);
  local_20 = &this->_has_bits_;
  local_24 = 0;
  if ((local_20->has_bits_[0] & 0xff) != 0) {
    bVar1 = has_name(this);
    if (bVar1) {
      psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      bVar1 = google::protobuf::internal::ArenaStringPtr::IsDefault(&this->name_,psVar2);
      local_c9 = 0;
      if (bVar1) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_c8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x31fb);
        local_c9 = 1;
        pLVar3 = google::protobuf::internal::LogMessage::operator<<
                           (&local_c8,
                            "CHECK failed: !name_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        google::protobuf::internal::LogFinisher::operator=(local_dd,pLVar3);
      }
      if ((local_c9 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_c8);
      }
      google::protobuf::internal::ArenaStringPtr::UnsafeRawStringPointer_abi_cxx11_(&this->name_);
      std::__cxx11::string::clear();
    }
    bVar1 = has_type(this);
    if (bVar1) {
      psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      bVar1 = google::protobuf::internal::ArenaStringPtr::IsDefault(&this->type_,psVar2);
      local_119 = 0;
      if (bVar1) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_118,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x31ff);
        local_119 = 1;
        pLVar3 = google::protobuf::internal::LogMessage::operator<<
                           (&local_118,
                            "CHECK failed: !type_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        google::protobuf::internal::LogFinisher::operator=(&local_11a,pLVar3);
      }
      if ((local_119 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_118);
      }
      google::protobuf::internal::ArenaStringPtr::UnsafeRawStringPointer_abi_cxx11_(&this->type_);
      std::__cxx11::string::clear();
    }
    bVar1 = has_transform_param(this);
    if (bVar1) {
      local_159 = 0;
      if (this->transform_param_ == (TransformationParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_158,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3203);
        local_159 = 1;
        pLVar3 = google::protobuf::internal::LogMessage::operator<<
                           (&local_158,"CHECK failed: transform_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_15a,pLVar3);
      }
      if ((local_159 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_158);
      }
      TransformationParameter::Clear(this->transform_param_);
    }
    bVar1 = has_loss_param(this);
    if (bVar1) {
      local_199 = 0;
      if (this->loss_param_ == (LossParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_198,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3207);
        local_199 = 1;
        pLVar3 = google::protobuf::internal::LogMessage::operator<<
                           (&local_198,"CHECK failed: loss_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_19a,pLVar3);
      }
      if ((local_199 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_198);
      }
      LossParameter::Clear(this->loss_param_);
    }
    bVar1 = has_accuracy_param(this);
    if (bVar1) {
      local_1d9 = 0;
      if (this->accuracy_param_ == (AccuracyParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_1d8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x320b);
        local_1d9 = 1;
        pLVar3 = google::protobuf::internal::LogMessage::operator<<
                           (&local_1d8,"CHECK failed: accuracy_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_1da,pLVar3);
      }
      if ((local_1d9 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_1d8);
      }
      AccuracyParameter::Clear(this->accuracy_param_);
    }
    bVar1 = has_argmax_param(this);
    if (bVar1) {
      local_219 = 0;
      if (this->argmax_param_ == (ArgMaxParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_218,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x320f);
        local_219 = 1;
        pLVar3 = google::protobuf::internal::LogMessage::operator<<
                           (&local_218,"CHECK failed: argmax_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_21a,pLVar3);
      }
      if ((local_219 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_218);
      }
      ArgMaxParameter::Clear(this->argmax_param_);
    }
    bVar1 = has_concat_param(this);
    if (bVar1) {
      local_259 = 0;
      if (this->concat_param_ == (ConcatParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_258,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3213);
        local_259 = 1;
        pLVar3 = google::protobuf::internal::LogMessage::operator<<
                           (&local_258,"CHECK failed: concat_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_25a,pLVar3);
      }
      if ((local_259 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_258);
      }
      ConcatParameter::Clear(this->concat_param_);
    }
    bVar1 = has_contrastive_loss_param(this);
    if (bVar1) {
      local_299 = 0;
      if (this->contrastive_loss_param_ == (ContrastiveLossParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_298,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3217);
        local_299 = 1;
        pLVar3 = google::protobuf::internal::LogMessage::operator<<
                           (&local_298,"CHECK failed: contrastive_loss_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_29a,pLVar3);
      }
      if ((local_299 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_298);
      }
      ContrastiveLossParameter::Clear(this->contrastive_loss_param_);
    }
  }
  local_30 = &this->_has_bits_;
  local_34 = 0;
  if ((local_30->has_bits_[0] & 0xff00) != 0) {
    bVar1 = has_convolution_param(this);
    if (bVar1) {
      local_2d9 = 0;
      if (this->convolution_param_ == (ConvolutionParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_2d8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x321d);
        local_2d9 = 1;
        pLVar3 = google::protobuf::internal::LogMessage::operator<<
                           (&local_2d8,"CHECK failed: convolution_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_2da,pLVar3);
      }
      if ((local_2d9 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_2d8);
      }
      ConvolutionParameter::Clear(this->convolution_param_);
    }
    bVar1 = has_data_param(this);
    if (bVar1) {
      local_319 = 0;
      if (this->data_param_ == (DataParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_318,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3221);
        local_319 = 1;
        pLVar3 = google::protobuf::internal::LogMessage::operator<<
                           (&local_318,"CHECK failed: data_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_31a,pLVar3);
      }
      if ((local_319 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_318);
      }
      DataParameter::Clear(this->data_param_);
    }
    bVar1 = has_dropout_param(this);
    if (bVar1) {
      local_359 = 0;
      if (this->dropout_param_ == (DropoutParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_358,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3225);
        local_359 = 1;
        pLVar3 = google::protobuf::internal::LogMessage::operator<<
                           (&local_358,"CHECK failed: dropout_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_35a,pLVar3);
      }
      if ((local_359 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_358);
      }
      DropoutParameter::Clear(this->dropout_param_);
    }
    bVar1 = has_dummy_data_param(this);
    if (bVar1) {
      local_399 = 0;
      if (this->dummy_data_param_ == (DummyDataParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_398,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3229);
        local_399 = 1;
        pLVar3 = google::protobuf::internal::LogMessage::operator<<
                           (&local_398,"CHECK failed: dummy_data_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_39a,pLVar3);
      }
      if ((local_399 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_398);
      }
      DummyDataParameter::Clear(this->dummy_data_param_);
    }
    bVar1 = has_eltwise_param(this);
    if (bVar1) {
      local_3d9 = 0;
      if (this->eltwise_param_ == (EltwiseParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_3d8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x322d);
        local_3d9 = 1;
        pLVar3 = google::protobuf::internal::LogMessage::operator<<
                           (&local_3d8,"CHECK failed: eltwise_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_3da,pLVar3);
      }
      if ((local_3d9 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_3d8);
      }
      EltwiseParameter::Clear(this->eltwise_param_);
    }
    bVar1 = has_exp_param(this);
    if (bVar1) {
      local_419 = 0;
      if (this->exp_param_ == (ExpParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_418,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3231);
        local_419 = 1;
        pLVar3 = google::protobuf::internal::LogMessage::operator<<
                           (&local_418,"CHECK failed: exp_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_41a,pLVar3);
      }
      if ((local_419 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_418);
      }
      ExpParameter::Clear(this->exp_param_);
    }
    bVar1 = has_hdf5_data_param(this);
    if (bVar1) {
      local_459 = 0;
      if (this->hdf5_data_param_ == (HDF5DataParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_458,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3235);
        local_459 = 1;
        pLVar3 = google::protobuf::internal::LogMessage::operator<<
                           (&local_458,"CHECK failed: hdf5_data_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_45a,pLVar3);
      }
      if ((local_459 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_458);
      }
      HDF5DataParameter::Clear(this->hdf5_data_param_);
    }
    bVar1 = has_hdf5_output_param(this);
    if (bVar1) {
      local_499 = 0;
      if (this->hdf5_output_param_ == (HDF5OutputParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_498,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3239);
        local_499 = 1;
        pLVar3 = google::protobuf::internal::LogMessage::operator<<
                           (&local_498,"CHECK failed: hdf5_output_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_49a,pLVar3);
      }
      if ((local_499 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_498);
      }
      HDF5OutputParameter::Clear(this->hdf5_output_param_);
    }
  }
  local_40 = &this->_has_bits_;
  local_44 = 0;
  if ((local_40->has_bits_[0] & 0xff0000) != 0) {
    bVar1 = has_hinge_loss_param(this);
    if (bVar1) {
      local_4d9 = 0;
      if (this->hinge_loss_param_ == (HingeLossParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_4d8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x323f);
        local_4d9 = 1;
        pLVar3 = google::protobuf::internal::LogMessage::operator<<
                           (&local_4d8,"CHECK failed: hinge_loss_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_4da,pLVar3);
      }
      if ((local_4d9 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_4d8);
      }
      HingeLossParameter::Clear(this->hinge_loss_param_);
    }
    bVar1 = has_image_data_param(this);
    if (bVar1) {
      local_519 = 0;
      if (this->image_data_param_ == (ImageDataParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_518,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3243);
        local_519 = 1;
        pLVar3 = google::protobuf::internal::LogMessage::operator<<
                           (&local_518,"CHECK failed: image_data_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51a,pLVar3);
      }
      if ((local_519 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_518);
      }
      ImageDataParameter::Clear(this->image_data_param_);
    }
    bVar1 = has_infogain_loss_param(this);
    if (bVar1) {
      local_559 = 0;
      if (this->infogain_loss_param_ == (InfogainLossParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_558,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3247);
        local_559 = 1;
        pLVar3 = google::protobuf::internal::LogMessage::operator<<
                           (&local_558,"CHECK failed: infogain_loss_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_55a,pLVar3);
      }
      if ((local_559 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_558);
      }
      InfogainLossParameter::Clear(this->infogain_loss_param_);
    }
    bVar1 = has_inner_product_param(this);
    if (bVar1) {
      local_599 = 0;
      if (this->inner_product_param_ == (InnerProductParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_598,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x324b);
        local_599 = 1;
        pLVar3 = google::protobuf::internal::LogMessage::operator<<
                           (&local_598,"CHECK failed: inner_product_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_59a,pLVar3);
      }
      if ((local_599 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_598);
      }
      InnerProductParameter::Clear(this->inner_product_param_);
    }
    bVar1 = has_lrn_param(this);
    if (bVar1) {
      local_5d9 = 0;
      if (this->lrn_param_ == (LRNParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_5d8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x324f);
        local_5d9 = 1;
        pLVar3 = google::protobuf::internal::LogMessage::operator<<
                           (&local_5d8,"CHECK failed: lrn_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_5da,pLVar3);
      }
      if ((local_5d9 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_5d8);
      }
      LRNParameter::Clear(this->lrn_param_);
    }
    bVar1 = has_memory_data_param(this);
    if (bVar1) {
      local_619 = 0;
      if (this->memory_data_param_ == (MemoryDataParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_618,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3253);
        local_619 = 1;
        pLVar3 = google::protobuf::internal::LogMessage::operator<<
                           (&local_618,"CHECK failed: memory_data_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_61a,pLVar3);
      }
      if ((local_619 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_618);
      }
      MemoryDataParameter::Clear(this->memory_data_param_);
    }
    bVar1 = has_mvn_param(this);
    if (bVar1) {
      local_659 = 0;
      if (this->mvn_param_ == (MVNParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_658,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3257);
        local_659 = 1;
        pLVar3 = google::protobuf::internal::LogMessage::operator<<
                           (&local_658,"CHECK failed: mvn_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_65a,pLVar3);
      }
      if ((local_659 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_658);
      }
      MVNParameter::Clear(this->mvn_param_);
    }
    bVar1 = has_pooling_param(this);
    if (bVar1) {
      local_699 = 0;
      if (this->pooling_param_ == (PoolingParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_698,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x325b);
        local_699 = 1;
        pLVar3 = google::protobuf::internal::LogMessage::operator<<
                           (&local_698,"CHECK failed: pooling_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_69a,pLVar3);
      }
      if ((local_699 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_698);
      }
      PoolingParameter::Clear(this->pooling_param_);
    }
  }
  local_50 = &this->_has_bits_;
  local_54 = 0;
  if ((local_50->has_bits_[0] & 0xff000000) != 0) {
    bVar1 = has_power_param(this);
    if (bVar1) {
      local_6d9 = 0;
      if (this->power_param_ == (PowerParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_6d8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3261);
        local_6d9 = 1;
        pLVar3 = google::protobuf::internal::LogMessage::operator<<
                           (&local_6d8,"CHECK failed: power_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_6da,pLVar3);
      }
      if ((local_6d9 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_6d8);
      }
      PowerParameter::Clear(this->power_param_);
    }
    bVar1 = has_relu_param(this);
    if (bVar1) {
      local_719 = 0;
      if (this->relu_param_ == (ReLUParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_718,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3265);
        local_719 = 1;
        pLVar3 = google::protobuf::internal::LogMessage::operator<<
                           (&local_718,"CHECK failed: relu_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_71a,pLVar3);
      }
      if ((local_719 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_718);
      }
      ReLUParameter::Clear(this->relu_param_);
    }
    bVar1 = has_sigmoid_param(this);
    if (bVar1) {
      local_759 = 0;
      if (this->sigmoid_param_ == (SigmoidParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_758,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3269);
        local_759 = 1;
        pLVar3 = google::protobuf::internal::LogMessage::operator<<
                           (&local_758,"CHECK failed: sigmoid_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_75a,pLVar3);
      }
      if ((local_759 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_758);
      }
      SigmoidParameter::Clear(this->sigmoid_param_);
    }
    bVar1 = has_softmax_param(this);
    if (bVar1) {
      local_799 = 0;
      if (this->softmax_param_ == (SoftmaxParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_798,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x326d);
        local_799 = 1;
        pLVar3 = google::protobuf::internal::LogMessage::operator<<
                           (&local_798,"CHECK failed: softmax_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_79a,pLVar3);
      }
      if ((local_799 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_798);
      }
      SoftmaxParameter::Clear(this->softmax_param_);
    }
    bVar1 = has_slice_param(this);
    if (bVar1) {
      local_7d9 = 0;
      if (this->slice_param_ == (SliceParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_7d8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3271);
        local_7d9 = 1;
        pLVar3 = google::protobuf::internal::LogMessage::operator<<
                           (&local_7d8,"CHECK failed: slice_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_7da,pLVar3);
      }
      if ((local_7d9 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_7d8);
      }
      SliceParameter::Clear(this->slice_param_);
    }
    bVar1 = has_tanh_param(this);
    if (bVar1) {
      local_819 = 0;
      if (this->tanh_param_ == (TanHParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_818,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3275);
        local_819 = 1;
        pLVar3 = google::protobuf::internal::LogMessage::operator<<
                           (&local_818,"CHECK failed: tanh_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_81a,pLVar3);
      }
      if ((local_819 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_818);
      }
      TanHParameter::Clear(this->tanh_param_);
    }
    bVar1 = has_threshold_param(this);
    if (bVar1) {
      local_859 = 0;
      if (this->threshold_param_ == (ThresholdParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_858,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3279);
        local_859 = 1;
        pLVar3 = google::protobuf::internal::LogMessage::operator<<
                           (&local_858,"CHECK failed: threshold_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_85a,pLVar3);
      }
      if ((local_859 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_858);
      }
      ThresholdParameter::Clear(this->threshold_param_);
    }
    bVar1 = has_window_data_param(this);
    if (bVar1) {
      local_899 = 0;
      if (this->window_data_param_ == (WindowDataParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_898,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x327d);
        local_899 = 1;
        pLVar3 = google::protobuf::internal::LogMessage::operator<<
                           (&local_898,"CHECK failed: window_data_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_89a,pLVar3);
      }
      if ((local_899 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_898);
      }
      WindowDataParameter::Clear(this->window_data_param_);
    }
  }
  local_60 = &this->_has_bits_;
  local_64 = 1;
  if (((this->_has_bits_).has_bits_[1] & 0xff) != 0) {
    bVar1 = has_python_param(this);
    if (bVar1) {
      local_8d9 = 0;
      if (this->python_param_ == (PythonParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_8d8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3283);
        local_8d9 = 1;
        pLVar3 = google::protobuf::internal::LogMessage::operator<<
                           (&local_8d8,"CHECK failed: python_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_8da,pLVar3);
      }
      if ((local_8d9 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_8d8);
      }
      PythonParameter::Clear(this->python_param_);
    }
    bVar1 = has_prelu_param(this);
    if (bVar1) {
      local_919 = 0;
      if (this->prelu_param_ == (PReLUParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_918,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3287);
        local_919 = 1;
        pLVar3 = google::protobuf::internal::LogMessage::operator<<
                           (&local_918,"CHECK failed: prelu_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_91a,pLVar3);
      }
      if ((local_919 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_918);
      }
      PReLUParameter::Clear(this->prelu_param_);
    }
    bVar1 = has_spp_param(this);
    if (bVar1) {
      local_959 = 0;
      if (this->spp_param_ == (SPPParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_958,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x328b);
        local_959 = 1;
        pLVar3 = google::protobuf::internal::LogMessage::operator<<
                           (&local_958,"CHECK failed: spp_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_95a,pLVar3);
      }
      if ((local_959 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_958);
      }
      SPPParameter::Clear(this->spp_param_);
    }
    bVar1 = has_reshape_param(this);
    if (bVar1) {
      local_999 = 0;
      if (this->reshape_param_ == (ReshapeParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_998,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x328f);
        local_999 = 1;
        pLVar3 = google::protobuf::internal::LogMessage::operator<<
                           (&local_998,"CHECK failed: reshape_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_99a,pLVar3);
      }
      if ((local_999 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_998);
      }
      ReshapeParameter::Clear(this->reshape_param_);
    }
    bVar1 = has_log_param(this);
    if (bVar1) {
      local_9d9 = 0;
      if (this->log_param_ == (LogParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_9d8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3293);
        local_9d9 = 1;
        pLVar3 = google::protobuf::internal::LogMessage::operator<<
                           (&local_9d8,"CHECK failed: log_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_9da,pLVar3);
      }
      if ((local_9d9 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_9d8);
      }
      LogParameter::Clear(this->log_param_);
    }
    bVar1 = has_flatten_param(this);
    if (bVar1) {
      local_a19 = 0;
      if (this->flatten_param_ == (FlattenParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_a18,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x3297);
        local_a19 = 1;
        pLVar3 = google::protobuf::internal::LogMessage::operator<<
                           (&local_a18,"CHECK failed: flatten_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_a1a,pLVar3);
      }
      if ((local_a19 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_a18);
      }
      FlattenParameter::Clear(this->flatten_param_);
    }
    bVar1 = has_reduction_param(this);
    if (bVar1) {
      local_a59 = 0;
      if (this->reduction_param_ == (ReductionParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_a58,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x329b);
        local_a59 = 1;
        pLVar3 = google::protobuf::internal::LogMessage::operator<<
                           (&local_a58,"CHECK failed: reduction_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_a5a,pLVar3);
      }
      if ((local_a59 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_a58);
      }
      ReductionParameter::Clear(this->reduction_param_);
    }
    bVar1 = has_embed_param(this);
    if (bVar1) {
      local_a99 = 0;
      if (this->embed_param_ == (EmbedParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_a98,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x329f);
        local_a99 = 1;
        pLVar3 = google::protobuf::internal::LogMessage::operator<<
                           (&local_a98,"CHECK failed: embed_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_a9a,pLVar3);
      }
      if ((local_a99 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_a98);
      }
      EmbedParameter::Clear(this->embed_param_);
    }
  }
  local_70 = &this->_has_bits_;
  local_74 = 1;
  if (((this->_has_bits_).has_bits_[1] & 0xff00) != 0) {
    bVar1 = has_tile_param(this);
    if (bVar1) {
      local_ad9 = 0;
      if (this->tile_param_ == (TileParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_ad8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x32a5);
        local_ad9 = 1;
        pLVar3 = google::protobuf::internal::LogMessage::operator<<
                           (&local_ad8,"CHECK failed: tile_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_ada,pLVar3);
      }
      if ((local_ad9 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_ad8);
      }
      TileParameter::Clear(this->tile_param_);
    }
    bVar1 = has_batch_norm_param(this);
    if (bVar1) {
      local_b19 = 0;
      if (this->batch_norm_param_ == (BatchNormParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_b18,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x32a9);
        local_b19 = 1;
        pLVar3 = google::protobuf::internal::LogMessage::operator<<
                           (&local_b18,"CHECK failed: batch_norm_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_b1a,pLVar3);
      }
      if ((local_b19 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_b18);
      }
      BatchNormParameter::Clear(this->batch_norm_param_);
    }
    bVar1 = has_elu_param(this);
    if (bVar1) {
      local_b59 = 0;
      if (this->elu_param_ == (ELUParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_b58,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x32ad);
        local_b59 = 1;
        pLVar3 = google::protobuf::internal::LogMessage::operator<<
                           (&local_b58,"CHECK failed: elu_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_b5a,pLVar3);
      }
      if ((local_b59 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_b58);
      }
      ELUParameter::Clear(this->elu_param_);
    }
    bVar1 = has_bias_param(this);
    if (bVar1) {
      local_b99 = 0;
      if (this->bias_param_ == (BiasParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_b98,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x32b1);
        local_b99 = 1;
        pLVar3 = google::protobuf::internal::LogMessage::operator<<
                           (&local_b98,"CHECK failed: bias_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_b9a,pLVar3);
      }
      if ((local_b99 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_b98);
      }
      BiasParameter::Clear(this->bias_param_);
    }
    bVar1 = has_scale_param(this);
    if (bVar1) {
      local_bd9 = 0;
      if (this->scale_param_ == (ScaleParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_bd8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x32b5);
        local_bd9 = 1;
        pLVar3 = google::protobuf::internal::LogMessage::operator<<
                           (&local_bd8,"CHECK failed: scale_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_bda,pLVar3);
      }
      if ((local_bd9 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_bd8);
      }
      ScaleParameter::Clear(this->scale_param_);
    }
    bVar1 = has_input_param(this);
    if (bVar1) {
      local_c19 = 0;
      if (this->input_param_ == (InputParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_c18,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x32b9);
        local_c19 = 1;
        pLVar3 = google::protobuf::internal::LogMessage::operator<<
                           (&local_c18,"CHECK failed: input_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_c1a,pLVar3);
      }
      if ((local_c19 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_c18);
      }
      InputParameter::Clear(this->input_param_);
    }
    bVar1 = has_crop_param(this);
    if (bVar1) {
      local_c59 = 0;
      if (this->crop_param_ == (CropParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_c58,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x32bd);
        local_c59 = 1;
        pLVar3 = google::protobuf::internal::LogMessage::operator<<
                           (&local_c58,"CHECK failed: crop_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_c5a,pLVar3);
      }
      if ((local_c59 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_c58);
      }
      CropParameter::Clear(this->crop_param_);
    }
    bVar1 = has_parameter_param(this);
    if (bVar1) {
      local_c99 = 0;
      if (this->parameter_param_ == (ParameterParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_c98,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x32c1);
        local_c99 = 1;
        pLVar3 = google::protobuf::internal::LogMessage::operator<<
                           (&local_c98,"CHECK failed: parameter_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_c9a,pLVar3);
      }
      if ((local_c99 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_c98);
      }
      ParameterParameter::Clear(this->parameter_param_);
    }
  }
  bVar1 = has_recurrent_param(this);
  if (bVar1) {
    local_cd9 = 0;
    if (this->recurrent_param_ == (RecurrentParameter *)0x0) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_cd8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                 ,0x32c6);
      local_cd9 = 1;
      pLVar3 = google::protobuf::internal::LogMessage::operator<<
                         (&local_cd8,"CHECK failed: recurrent_param_ != NULL: ");
      google::protobuf::internal::LogFinisher::operator=(&local_cda,pLVar3);
    }
    if ((local_cd9 & 1) != 0) {
      google::protobuf::internal::LogMessage::~LogMessage(&local_cd8);
    }
    RecurrentParameter::Clear(this->recurrent_param_);
  }
  this->phase_ = 0;
  local_18 = &this->_has_bits_;
  memset(local_18,0,8);
  this_local = (LayerParameter *)&this->_internal_metadata_;
  if (((uint)(((InternalMetadataWithArena *)this_local)->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    local_80 = (InternalMetadataWithArena *)this_local;
    local_10 = (InternalMetadataWithArena *)this_local;
    google::protobuf::internal::InternalMetadataWithArena::DoClear
              ((InternalMetadataWithArena *)this_local);
  }
  return;
}

Assistant:

void LayerParameter::Clear() {
// @@protoc_insertion_point(message_clear_start:caffe.LayerParameter)
  bottom_.Clear();
  top_.Clear();
  loss_weight_.Clear();
  param_.Clear();
  blobs_.Clear();
  include_.Clear();
  exclude_.Clear();
  propagate_down_.Clear();
  if (_has_bits_[0 / 32] & 255u) {
    if (has_name()) {
      GOOGLE_DCHECK(!name_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*name_.UnsafeRawStringPointer())->clear();
    }
    if (has_type()) {
      GOOGLE_DCHECK(!type_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*type_.UnsafeRawStringPointer())->clear();
    }
    if (has_transform_param()) {
      GOOGLE_DCHECK(transform_param_ != NULL);
      transform_param_->::caffe::TransformationParameter::Clear();
    }
    if (has_loss_param()) {
      GOOGLE_DCHECK(loss_param_ != NULL);
      loss_param_->::caffe::LossParameter::Clear();
    }
    if (has_accuracy_param()) {
      GOOGLE_DCHECK(accuracy_param_ != NULL);
      accuracy_param_->::caffe::AccuracyParameter::Clear();
    }
    if (has_argmax_param()) {
      GOOGLE_DCHECK(argmax_param_ != NULL);
      argmax_param_->::caffe::ArgMaxParameter::Clear();
    }
    if (has_concat_param()) {
      GOOGLE_DCHECK(concat_param_ != NULL);
      concat_param_->::caffe::ConcatParameter::Clear();
    }
    if (has_contrastive_loss_param()) {
      GOOGLE_DCHECK(contrastive_loss_param_ != NULL);
      contrastive_loss_param_->::caffe::ContrastiveLossParameter::Clear();
    }
  }
  if (_has_bits_[8 / 32] & 65280u) {
    if (has_convolution_param()) {
      GOOGLE_DCHECK(convolution_param_ != NULL);
      convolution_param_->::caffe::ConvolutionParameter::Clear();
    }
    if (has_data_param()) {
      GOOGLE_DCHECK(data_param_ != NULL);
      data_param_->::caffe::DataParameter::Clear();
    }
    if (has_dropout_param()) {
      GOOGLE_DCHECK(dropout_param_ != NULL);
      dropout_param_->::caffe::DropoutParameter::Clear();
    }
    if (has_dummy_data_param()) {
      GOOGLE_DCHECK(dummy_data_param_ != NULL);
      dummy_data_param_->::caffe::DummyDataParameter::Clear();
    }
    if (has_eltwise_param()) {
      GOOGLE_DCHECK(eltwise_param_ != NULL);
      eltwise_param_->::caffe::EltwiseParameter::Clear();
    }
    if (has_exp_param()) {
      GOOGLE_DCHECK(exp_param_ != NULL);
      exp_param_->::caffe::ExpParameter::Clear();
    }
    if (has_hdf5_data_param()) {
      GOOGLE_DCHECK(hdf5_data_param_ != NULL);
      hdf5_data_param_->::caffe::HDF5DataParameter::Clear();
    }
    if (has_hdf5_output_param()) {
      GOOGLE_DCHECK(hdf5_output_param_ != NULL);
      hdf5_output_param_->::caffe::HDF5OutputParameter::Clear();
    }
  }
  if (_has_bits_[16 / 32] & 16711680u) {
    if (has_hinge_loss_param()) {
      GOOGLE_DCHECK(hinge_loss_param_ != NULL);
      hinge_loss_param_->::caffe::HingeLossParameter::Clear();
    }
    if (has_image_data_param()) {
      GOOGLE_DCHECK(image_data_param_ != NULL);
      image_data_param_->::caffe::ImageDataParameter::Clear();
    }
    if (has_infogain_loss_param()) {
      GOOGLE_DCHECK(infogain_loss_param_ != NULL);
      infogain_loss_param_->::caffe::InfogainLossParameter::Clear();
    }
    if (has_inner_product_param()) {
      GOOGLE_DCHECK(inner_product_param_ != NULL);
      inner_product_param_->::caffe::InnerProductParameter::Clear();
    }
    if (has_lrn_param()) {
      GOOGLE_DCHECK(lrn_param_ != NULL);
      lrn_param_->::caffe::LRNParameter::Clear();
    }
    if (has_memory_data_param()) {
      GOOGLE_DCHECK(memory_data_param_ != NULL);
      memory_data_param_->::caffe::MemoryDataParameter::Clear();
    }
    if (has_mvn_param()) {
      GOOGLE_DCHECK(mvn_param_ != NULL);
      mvn_param_->::caffe::MVNParameter::Clear();
    }
    if (has_pooling_param()) {
      GOOGLE_DCHECK(pooling_param_ != NULL);
      pooling_param_->::caffe::PoolingParameter::Clear();
    }
  }
  if (_has_bits_[24 / 32] & 4278190080u) {
    if (has_power_param()) {
      GOOGLE_DCHECK(power_param_ != NULL);
      power_param_->::caffe::PowerParameter::Clear();
    }
    if (has_relu_param()) {
      GOOGLE_DCHECK(relu_param_ != NULL);
      relu_param_->::caffe::ReLUParameter::Clear();
    }
    if (has_sigmoid_param()) {
      GOOGLE_DCHECK(sigmoid_param_ != NULL);
      sigmoid_param_->::caffe::SigmoidParameter::Clear();
    }
    if (has_softmax_param()) {
      GOOGLE_DCHECK(softmax_param_ != NULL);
      softmax_param_->::caffe::SoftmaxParameter::Clear();
    }
    if (has_slice_param()) {
      GOOGLE_DCHECK(slice_param_ != NULL);
      slice_param_->::caffe::SliceParameter::Clear();
    }
    if (has_tanh_param()) {
      GOOGLE_DCHECK(tanh_param_ != NULL);
      tanh_param_->::caffe::TanHParameter::Clear();
    }
    if (has_threshold_param()) {
      GOOGLE_DCHECK(threshold_param_ != NULL);
      threshold_param_->::caffe::ThresholdParameter::Clear();
    }
    if (has_window_data_param()) {
      GOOGLE_DCHECK(window_data_param_ != NULL);
      window_data_param_->::caffe::WindowDataParameter::Clear();
    }
  }
  if (_has_bits_[32 / 32] & 255u) {
    if (has_python_param()) {
      GOOGLE_DCHECK(python_param_ != NULL);
      python_param_->::caffe::PythonParameter::Clear();
    }
    if (has_prelu_param()) {
      GOOGLE_DCHECK(prelu_param_ != NULL);
      prelu_param_->::caffe::PReLUParameter::Clear();
    }
    if (has_spp_param()) {
      GOOGLE_DCHECK(spp_param_ != NULL);
      spp_param_->::caffe::SPPParameter::Clear();
    }
    if (has_reshape_param()) {
      GOOGLE_DCHECK(reshape_param_ != NULL);
      reshape_param_->::caffe::ReshapeParameter::Clear();
    }
    if (has_log_param()) {
      GOOGLE_DCHECK(log_param_ != NULL);
      log_param_->::caffe::LogParameter::Clear();
    }
    if (has_flatten_param()) {
      GOOGLE_DCHECK(flatten_param_ != NULL);
      flatten_param_->::caffe::FlattenParameter::Clear();
    }
    if (has_reduction_param()) {
      GOOGLE_DCHECK(reduction_param_ != NULL);
      reduction_param_->::caffe::ReductionParameter::Clear();
    }
    if (has_embed_param()) {
      GOOGLE_DCHECK(embed_param_ != NULL);
      embed_param_->::caffe::EmbedParameter::Clear();
    }
  }
  if (_has_bits_[40 / 32] & 65280u) {
    if (has_tile_param()) {
      GOOGLE_DCHECK(tile_param_ != NULL);
      tile_param_->::caffe::TileParameter::Clear();
    }
    if (has_batch_norm_param()) {
      GOOGLE_DCHECK(batch_norm_param_ != NULL);
      batch_norm_param_->::caffe::BatchNormParameter::Clear();
    }
    if (has_elu_param()) {
      GOOGLE_DCHECK(elu_param_ != NULL);
      elu_param_->::caffe::ELUParameter::Clear();
    }
    if (has_bias_param()) {
      GOOGLE_DCHECK(bias_param_ != NULL);
      bias_param_->::caffe::BiasParameter::Clear();
    }
    if (has_scale_param()) {
      GOOGLE_DCHECK(scale_param_ != NULL);
      scale_param_->::caffe::ScaleParameter::Clear();
    }
    if (has_input_param()) {
      GOOGLE_DCHECK(input_param_ != NULL);
      input_param_->::caffe::InputParameter::Clear();
    }
    if (has_crop_param()) {
      GOOGLE_DCHECK(crop_param_ != NULL);
      crop_param_->::caffe::CropParameter::Clear();
    }
    if (has_parameter_param()) {
      GOOGLE_DCHECK(parameter_param_ != NULL);
      parameter_param_->::caffe::ParameterParameter::Clear();
    }
  }
  if (has_recurrent_param()) {
    GOOGLE_DCHECK(recurrent_param_ != NULL);
    recurrent_param_->::caffe::RecurrentParameter::Clear();
  }
  phase_ = 0;
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}